

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocation.cc
# Opt level: O0

void * bas::aligned_malloc_fallback(size_t size,size_t alignment)

{
  void *ptr;
  uintptr_t uVar1;
  ulong ptr_00;
  MemHeader *pMVar2;
  MemHeader *head;
  uintptr_t aligned_ptr;
  uintptr_t real_ptr;
  size_t malloc_size;
  size_t alignment_local;
  size_t size_local;
  
  ptr = malloc(size + alignment + 3);
  uVar1 = ptr_to_int<void>(ptr);
  if (uVar1 == 0) {
    size_local = 0;
  }
  else {
    ptr_00 = uVar1 + alignment + 3 & (alignment - 1 ^ 0xffffffffffffffff);
    pMVar2 = int_to_ptr<bas::MemHeader>(ptr_00 - 4);
    pMVar2->offset = (int)ptr_00 - (int)uVar1;
    size_local = (size_t)int_to_ptr<void>(ptr_00);
  }
  return (void *)size_local;
}

Assistant:

void *aligned_malloc_fallback(size_t size, size_t alignment)
{
    size_t malloc_size = size + sizeof(MemHeader) + alignment - 1;
    uintptr_t real_ptr = ptr_to_int(malloc(malloc_size));
    if (real_ptr == 0) {
        return nullptr;
    }

    uintptr_t aligned_ptr = (real_ptr + sizeof(MemHeader) + alignment - 1) &
                            ~(alignment - 1);
    MemHeader *head = int_to_ptr<MemHeader>(aligned_ptr - sizeof(MemHeader));
    head->offset = (int)(aligned_ptr - real_ptr);

    return int_to_ptr<void>(aligned_ptr);
}